

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl3.h
# Opt level: O0

void nk_glfw3_device_upload_atlas(nk_glfw *glfw,void *image,int width,int height)

{
  GLsizei in_ECX;
  GLsizei in_EDX;
  void *in_RSI;
  long in_RDI;
  nk_glfw_device *dev;
  
  (*glad_glGenTextures)(1,(GLuint *)(in_RDI + 0xcc));
  (*glad_glBindTexture)(0xde1,*(GLuint *)(in_RDI + 0xcc));
  (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  (*glad_glTexImage2D)(0xde1,0,0x1908,in_EDX,in_ECX,0,0x1908,0x1401,in_RSI);
  return;
}

Assistant:

NK_INTERN void
nk_glfw3_device_upload_atlas(struct nk_glfw* glfw, const void *image, int width, int height)
{
    struct nk_glfw_device *dev = &glfw->ogl;
    glGenTextures(1, &dev->font_tex);
    glBindTexture(GL_TEXTURE_2D, dev->font_tex);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, (GLsizei)width, (GLsizei)height, 0,
                GL_RGBA, GL_UNSIGNED_BYTE, image);
}